

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O1

op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
* __thiscall
asio::cancellation_slot::
emplace<asio::experimental::detail::channel_service<asio::detail::null_mutex>::op_cancellation<asio::experimental::channel_traits<>,void(std::error_code,std::__cxx11::string)>,asio::experimental::detail::channel_service<asio::detail::null_mutex>*,asio::experimental::detail::channel_service<asio::detail::null_mutex>::implementation_type<asio::experimental::channel_traits<>,void(std::error_code,std::__cxx11::string)>*>
          (cancellation_slot *this,channel_service<asio::detail::null_mutex> **args,
          implementation_type<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          **args_1)

{
  implementation_type<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *piVar1;
  int iVar2;
  undefined4 extraout_var;
  cancellation_handler_base *pcVar3;
  _func_int **extraout_RDX;
  undefined8 uVar4;
  _func_int **pp_Var5;
  long in_FS_OFFSET;
  
  if (*this->handler_ == (cancellation_handler_base *)0x0) {
    pp_Var5 = (_func_int **)0x0;
    pcVar3 = (cancellation_handler_base *)0x0;
  }
  else {
    iVar2 = (*(*this->handler_)->_vptr_cancellation_handler_base[1])();
    pcVar3 = (cancellation_handler_base *)CONCAT44(extraout_var,iVar2);
    *this->handler_ = (cancellation_handler_base *)0x0;
    pp_Var5 = extraout_RDX;
  }
  if (pp_Var5 < (_func_int **)0x20 || ((ulong)pcVar3 & 7) != 0) {
    if (pcVar3 != (cancellation_handler_base *)0x0) {
      if (*(long *)(in_FS_OFFSET + -0x240) == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x240) + 8);
      }
      detail::thread_info_base::deallocate<asio::detail::thread_info_base::cancellation_signal_tag>
                (uVar4,pcVar3,pp_Var5);
    }
    if (*(long *)(in_FS_OFFSET + -0x240) == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x240) + 8);
    }
    pp_Var5 = (_func_int **)0x20;
    pcVar3 = (cancellation_handler_base *)
             detail::thread_info_base::
             allocate<asio::detail::thread_info_base::cancellation_signal_tag>(uVar4,0x20,8);
  }
  pcVar3->_vptr_cancellation_handler_base = (_func_int **)&PTR_call_0035ffd0;
  piVar1 = *args_1;
  pcVar3[1]._vptr_cancellation_handler_base = (_func_int **)*args;
  pcVar3[2]._vptr_cancellation_handler_base = (_func_int **)piVar1;
  pcVar3[3]._vptr_cancellation_handler_base = pp_Var5;
  *this->handler_ = pcVar3;
  return (op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *)(pcVar3 + 1);
}

Assistant:

CancellationHandler& emplace(ASIO_MOVE_ARG(Args)... args)
  {
    typedef detail::cancellation_handler<CancellationHandler>
      cancellation_handler_type;
    auto_delete_helper del = { prepare_memory(
        sizeof(cancellation_handler_type),
        ASIO_ALIGNOF(CancellationHandler)) };
    cancellation_handler_type* handler_obj =
      new (del.mem.first) cancellation_handler_type(
        del.mem.second, ASIO_MOVE_CAST(Args)(args)...);
    del.mem.first = 0;
    *handler_ = handler_obj;
    return handler_obj->handler();
  }